

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion p;
  uint uVar2;
  uint uVar3;
  JSValue v;
  JSValue v_00;
  JSValue JVar4;
  int end;
  int start;
  uint local_3c;
  JSValueUnion local_38;
  uint local_2c;
  
  JVar4 = JS_ToStringCheckObject(ctx,this_val);
  v.tag = JVar4.tag;
  p = JVar4.u;
  uVar2 = (uint)JVar4.tag;
  if (uVar2 != 6) {
    uVar3 = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
    local_38 = p;
    iVar1 = JS_ToInt32Clamp(ctx,(int *)&local_2c,*argv,0,uVar3,uVar3);
    if ((iVar1 == 0) &&
       ((local_3c = uVar3, (int)argv[1].tag == 3 ||
        (JVar4.tag = argv[1].tag, JVar4.u.ptr = argv[1].u.ptr,
        iVar1 = JS_ToInt32Clamp(ctx,(int *)&local_3c,JVar4,0,uVar3,uVar3), iVar1 == 0)))) {
      uVar3 = local_3c;
      if ((int)local_3c <= (int)local_2c) {
        uVar3 = local_2c;
      }
      JVar4 = js_sub_string(ctx,(JSString *)p.ptr,local_2c,uVar3);
      if ((0xfffffff4 < uVar2) &&
         (iVar1 = *local_38.ptr, *(int *)local_38.ptr = iVar1 + -1, iVar1 < 2)) {
        v_00.tag = v.tag;
        v_00.u.ptr = local_38.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
    }
    else {
      if ((0xfffffff4 < uVar2) &&
         (iVar1 = *local_38.ptr, *(int *)local_38.ptr = iVar1 + -1, iVar1 < 2)) {
        v.u.ptr = local_38.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      JVar4 = (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  return JVar4;
}

Assistant:

static JSValue js_string_slice(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int len, start, end;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    end = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &end, argv[1], 0, len, len)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    ret = js_sub_string(ctx, p, start, max_int(end, start));
    JS_FreeValue(ctx, str);
    return ret;
}